

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# General.cc
# Opt level: O0

void __thiscall
General_clearEquivalentToAllDisconnects_Test::TestBody
          (General_clearEquivalentToAllDisconnects_Test *this)

{
  bool bVar1;
  socklen_t in_ECX;
  socklen_t __len;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  Connection conn2_1;
  Connection conn1_1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Connection conn2;
  Connection conn1;
  Signal<void_()> s;
  anon_class_8_1_a7bac0f5 slot;
  int calls;
  shared_ptr<sigs::ConnectionBase> *in_stack_fffffffffffffe08;
  BasicSignal<void_(),_std::lock_guard<std::mutex>_> *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int line;
  Message *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  Type in_stack_fffffffffffffe2c;
  AssertHelper *in_stack_fffffffffffffe30;
  BasicSignal<void_(),_std::lock_guard<std::mutex>_> *in_stack_fffffffffffffe40;
  optional<std::shared_ptr<sigs::ConnectionBase>_> *in_stack_fffffffffffffe48;
  BasicSignal<void_(),_std::lock_guard<std::mutex>_> *in_stack_fffffffffffffe50;
  Message *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 uVar2;
  AssertionResult local_188;
  sockaddr local_178 [2];
  undefined1 local_158 [48];
  undefined1 local_128 [76];
  undefined4 local_dc;
  AssertionResult local_d8;
  sockaddr local_c8 [2];
  undefined1 local_a8 [48];
  BasicSignal<void_(),_std::lock_guard<std::mutex>_> local_78;
  undefined4 *local_18;
  undefined4 local_c [3];
  
  local_c[0] = 0;
  local_18 = local_c;
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::BasicSignal(in_stack_fffffffffffffe10);
  local_c[0] = 0;
  std::function<void()>::
  function<General_clearEquivalentToAllDisconnects_Test::TestBody()::__0_const&,void>
            ((function<void_()> *)in_stack_fffffffffffffe10,
             (anon_class_8_1_a7bac0f5 *)in_stack_fffffffffffffe08);
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::connect
            (&local_78,(int)&local_78 + 0x10,(sockaddr *)(local_a8 + 0x10),in_ECX);
  std::function<void_()>::~function((function<void_()> *)0x129b11);
  std::function<void()>::
  function<General_clearEquivalentToAllDisconnects_Test::TestBody()::__0_const&,void>
            ((function<void_()> *)in_stack_fffffffffffffe10,
             (anon_class_8_1_a7bac0f5 *)in_stack_fffffffffffffe08);
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::connect
            ((BasicSignal<void_(),_std::lock_guard<std::mutex>_> *)local_a8,(int)&local_78 + 0x10,
             local_c8,in_ECX);
  std::function<void_()>::~function((function<void_()> *)0x129b50);
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::operator()(in_stack_fffffffffffffe40);
  local_dc = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (char *)in_stack_fffffffffffffe20,
             (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (int *)in_stack_fffffffffffffe10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar1) {
    testing::Message::Message(in_stack_fffffffffffffe20);
    testing::AssertionResult::failure_message((AssertionResult *)0x129bc2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,(char *)in_stack_fffffffffffffe20
               ,in_stack_fffffffffffffe1c,(char *)in_stack_fffffffffffffe10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
    testing::Message::~Message((Message *)0x129c12);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x129c1f);
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::clear(in_stack_fffffffffffffe40);
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::operator()(in_stack_fffffffffffffe40);
  local_128._36_4_ = 2;
  __len = (socklen_t)local_c;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (char *)in_stack_fffffffffffffe20,
             (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (int *)in_stack_fffffffffffffe10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_128 + 0x28));
  if (!bVar1) {
    testing::Message::Message(in_stack_fffffffffffffe20);
    testing::AssertionResult::failure_message((AssertionResult *)0x129c9e);
    __len = 0x122;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,(char *)in_stack_fffffffffffffe20
               ,in_stack_fffffffffffffe1c,(char *)in_stack_fffffffffffffe10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
    testing::Message::~Message((Message *)0x129cee);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x129cfb);
  std::shared_ptr<sigs::ConnectionBase>::~shared_ptr((shared_ptr<sigs::ConnectionBase> *)0x129d08);
  std::shared_ptr<sigs::ConnectionBase>::~shared_ptr((shared_ptr<sigs::ConnectionBase> *)0x129d15);
  local_c[0] = 0;
  std::function<void()>::
  function<General_clearEquivalentToAllDisconnects_Test::TestBody()::__0_const&,void>
            ((function<void_()> *)in_stack_fffffffffffffe10,
             (anon_class_8_1_a7bac0f5 *)in_stack_fffffffffffffe08);
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::connect
            ((BasicSignal<void_(),_std::lock_guard<std::mutex>_> *)local_128,(int)&local_78 + 0x10,
             (sockaddr *)(local_158 + 0x10),__len);
  std::function<void_()>::~function((function<void_()> *)0x129d5f);
  std::function<void()>::
  function<General_clearEquivalentToAllDisconnects_Test::TestBody()::__0_const&,void>
            ((function<void_()> *)in_stack_fffffffffffffe10,
             (anon_class_8_1_a7bac0f5 *)in_stack_fffffffffffffe08);
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::connect
            ((BasicSignal<void_(),_std::lock_guard<std::mutex>_> *)local_158,(int)&local_78 + 0x10,
             local_178,__len);
  std::function<void_()>::~function((function<void_()> *)0x129d9e);
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::operator()(in_stack_fffffffffffffe40);
  uVar2 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (char *)in_stack_fffffffffffffe20,
             (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (int *)in_stack_fffffffffffffe10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar1) {
    testing::Message::Message(in_stack_fffffffffffffe20);
    testing::AssertionResult::failure_message((AssertionResult *)0x129dfe);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,(char *)in_stack_fffffffffffffe20
               ,in_stack_fffffffffffffe1c,(char *)in_stack_fffffffffffffe10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
    testing::Message::~Message((Message *)0x129e3f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x129e49);
  std::optional<std::shared_ptr<sigs::ConnectionBase>_>::
  optional<std::shared_ptr<sigs::ConnectionBase>_&,_true>
            ((optional<std::shared_ptr<sigs::ConnectionBase>_> *)in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08);
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::disconnect
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::optional<std::shared_ptr<sigs::ConnectionBase>_>::~optional
            ((optional<std::shared_ptr<sigs::ConnectionBase>_> *)0x129e77);
  std::optional<std::shared_ptr<sigs::ConnectionBase>_>::
  optional<std::shared_ptr<sigs::ConnectionBase>_&,_true>
            ((optional<std::shared_ptr<sigs::ConnectionBase>_> *)in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08);
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::disconnect
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::optional<std::shared_ptr<sigs::ConnectionBase>_>::~optional
            ((optional<std::shared_ptr<sigs::ConnectionBase>_> *)0x129ea5);
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::operator()(in_stack_fffffffffffffe40);
  line = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (char *)in_stack_fffffffffffffe20,(int *)CONCAT44(2,in_stack_fffffffffffffe18),
             (int *)in_stack_fffffffffffffe10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffe20);
  if (!bVar1) {
    testing::Message::Message(in_stack_fffffffffffffe20);
    testing::AssertionResult::failure_message((AssertionResult *)0x129f05);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,(char *)in_stack_fffffffffffffe20
               ,line,(char *)in_stack_fffffffffffffe10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
    testing::Message::~Message((Message *)0x129f40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x129f4a);
  std::shared_ptr<sigs::ConnectionBase>::~shared_ptr((shared_ptr<sigs::ConnectionBase> *)0x129f57);
  std::shared_ptr<sigs::ConnectionBase>::~shared_ptr((shared_ptr<sigs::ConnectionBase> *)0x129f64);
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::~BasicSignal(in_stack_fffffffffffffe40);
  return;
}

Assistant:

TEST(General, clearEquivalentToAllDisconnects)
{
  int calls = 0;
  const auto slot = [&calls] { calls++; };

  sigs::Signal<void()> s;

  {
    calls = 0;
    auto conn1 = s.connect(slot);
    auto conn2 = s.connect(slot);
    s();
    EXPECT_EQ(calls, 2);

    s.clear();
    s();
    EXPECT_EQ(calls, 2);
  }

  {
    calls = 0;
    auto conn1 = s.connect(slot);
    auto conn2 = s.connect(slot);
    s();
    EXPECT_EQ(calls, 2);

    s.disconnect(conn1);
    s.disconnect(conn2);
    s();
    EXPECT_EQ(calls, 2);
  }
}